

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

int cnn::rand0n(int n)

{
  float fVar1;
  
  if (0 < n) {
    fVar1 = rand01();
    while ((int)(fVar1 * (float)n) == n) {
      fVar1 = rand01();
    }
    return (int)(fVar1 * (float)n);
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.cc"
                ,0x90,"int cnn::rand0n(int)");
}

Assistant:

int rand0n(int n) {
  assert(n > 0);
  int x = rand01() * n;
  while(n == x) { x = rand01() * n; }
  return x;
}